

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::EvalContext::getAllDiagnostics(EvalContext *this)

{
  Diagnostics *in_RSI;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  Diagnostics *results;
  SmallVectorBase<slang::Diagnostic> *this_00;
  
  this_00 = in_RDI;
  Diagnostics::Diagnostics((Diagnostics *)0x9894cf);
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>(this_00,in_RSI);
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>(this_00,in_RSI);
  return (Diagnostics *)in_RDI;
}

Assistant:

Diagnostics EvalContext::getAllDiagnostics() const {
    Diagnostics results;
    results.append_range(diags);
    results.append_range(warnings);
    return results;
}